

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::device_tree::resolve_cross_references(device_tree *this,uint32_t *phandle)

{
  pointer *this_00;
  pointer *pprVar1;
  fixup *pfVar2;
  pointer ppVar3;
  property_value *ppVar4;
  pointer pcVar5;
  pointer psVar6;
  element_type *peVar7;
  size_t sVar8;
  iterator __position;
  string *psVar9;
  undefined8 uVar10;
  int iVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  reference_wrapper<dtc::fdt::device_tree::fixup> *prVar12;
  mapped_type *pmVar13;
  string *s;
  pointer psVar14;
  fixup *i;
  pointer ppVar15;
  node_ptr target;
  string node_name;
  string node_address;
  string path_1;
  string possible;
  node_ptr next;
  string target_name;
  string path_element;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
  sorted_phandles;
  unordered_map<dtc::fdt::property_value_*,_dtc::fdt::device_tree::fixup_&,_std::hash<dtc::fdt::property_value_*>,_std::equal_to<dtc::fdt::property_value_*>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>_>
  phandle_set;
  node_path path;
  istringstream nss;
  element_type *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4d0;
  undefined1 *local_4c8;
  size_t local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_4a8;
  reference_wrapper<dtc::fdt::device_tree::fixup> *local_4a0;
  undefined1 *local_498;
  size_t local_490;
  undefined1 local_488;
  undefined7 uStack_487;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  undefined1 local_458 [48];
  key_type local_428;
  undefined1 *local_408;
  size_t local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  element_type *local_3e8;
  __node_base local_3e0;
  reference_wrapper<dtc::fdt::device_tree::fixup> *local_3d8;
  reference_wrapper<dtc::fdt::device_tree::fixup> *prStack_3d0;
  size_t local_3c8;
  vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
  *local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_3b8;
  uint32_t *local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  _Any_data local_388;
  pointer local_378;
  code *pcStack_370;
  _Hashtable<dtc::fdt::property_value_*,_std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>,_std::__detail::_Select1st,_std::equal_to<dtc::fdt::property_value_*>,_std::hash<dtc::fdt::property_value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_368;
  undefined1 local_330 [384];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  prVar12 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)
            (this->cross_references).
            super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4a0 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)
              (this->cross_references).
              super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3b0 = phandle;
  if (prVar12 != local_4a0) {
    local_4a8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->node_paths;
    do {
      pfVar2 = prVar12->_M_data;
      __x = &std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_4a8,
                          (key_type *)
                          &(pfVar2->prop).
                           super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount)->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_330,__x);
      uVar10 = local_330._8_8_;
      if (local_330._0_8_ != local_330._8_8_) {
        if ((pointer)(local_330._0_8_ + 0x40) != (pointer)local_330._8_8_) {
          this_00 = &pfVar2[1].path.
                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          s = &((pointer)(local_330._0_8_ + 0x40))->second;
          do {
            local_1b0[0] = (istringstream)0x2f;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                       (uchar *)local_1b0);
            push_string((byte_buffer *)this_00,s + -1,false);
            if (s->_M_string_length != 0) {
              local_1b0[0] = (istringstream)0x40;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                         (uchar *)local_1b0);
              push_string((byte_buffer *)this_00,s,false);
            }
            psVar9 = s + 1;
            s = s + 2;
          } while (psVar9 != (string *)uVar10);
        }
        local_1b0[0] = (istringstream)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &pfVar2[1].path.
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(uchar *)local_1b0);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_330);
      prVar12 = prVar12 + 1;
    } while (prVar12 != local_4a0);
  }
  local_368._M_buckets = &local_368._M_single_bucket;
  local_368._M_bucket_count = 1;
  local_368._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_368._M_element_count = 0;
  local_368._M_rehash_policy._M_max_load_factor = 1.0;
  local_368._M_rehash_policy._M_next_resize = 0;
  local_368._M_single_bucket = (__node_base_ptr)0x0;
  ppVar15 = (pointer)(this->fixups).
                     super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (pointer)(this->fixups).
                    super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar3) {
    do {
      local_330._0_8_ = (ppVar15->second)._M_string_length;
      local_330._8_8_ = ppVar15;
      std::
      _Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>
                ((_Hashtable<dtc::fdt::property_value*,std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>,std::allocator<std::pair<dtc::fdt::property_value*const,dtc::fdt::device_tree::fixup&>>,std::__detail::_Select1st,std::equal_to<dtc::fdt::property_value*>,std::hash<dtc::fdt::property_value*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_368,local_330);
      ppVar15 = (pointer)&(ppVar15->second).field_2;
    } while (ppVar15 != ppVar3);
  }
  local_388._8_8_ = &local_3d8;
  local_3d8 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0;
  prStack_3d0 = (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0;
  local_3c8 = 0;
  local_388._M_unused._M_object = &local_368;
  pcStack_370 = std::
                _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
                ::_M_invoke;
  local_378 = (pointer)std::
                       _Function_handler<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc:1406:14)>
                       ::_M_manager;
  node::visit((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *)
              &local_388,(node *)0x0);
  if (local_378 != (pointer)0x0) {
    (*(code *)local_378)(&local_388,&local_388,3);
  }
  if ((long)prStack_3d0 - (long)local_3d8 >> 3 !=
      ((long)(this->fixups).
             super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->fixups).
             super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
    __assert_fail("sorted_phandles.size() == fixups.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x58d,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
  }
  if (local_3d8 != prStack_3d0) {
    local_4a8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->node_names;
    local_3b8 = &(this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    local_3c0 = (vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
                 *)&this->unresolved_fixups;
    local_4a0 = prStack_3d0;
    prVar12 = local_3d8;
    do {
      ppVar4 = prVar12->_M_data->val;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      pcVar5 = (ppVar4->string_data)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_458 + 0x30),pcVar5,pcVar5 + (ppVar4->string_data)._M_string_length
                );
      _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_458._0_8_ = local_458 + 0x10;
      local_458._8_8_ = (pointer)0x0;
      local_458[0x10] = 0;
      if (*local_428._M_dataplus._M_p == '/') {
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        local_478._M_string_length = 0;
        local_478.field_2._M_local_buf[0] = '\0';
        local_4d8 = (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_4d0,local_3b8);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_330,(string *)(local_458 + 0x30),_S_in);
        local_408 = &local_3f8;
        local_400 = 0;
        local_3f8 = 0;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_330,(string *)&local_408,'/');
        do {
          if ((local_330[(((pointer)(local_330._0_8_ + -0x40))->second)._M_string_length + 0x20] & 2
              ) != 0) break;
          std::__cxx11::string::push_back((char)&local_478);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_330,(string *)&local_408,'/');
          std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_408,_S_in);
          local_4c0 = 0;
          local_4b8 = 0;
          local_498 = &local_488;
          local_490 = 0;
          local_488 = 0;
          local_4c8 = &local_4b8;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1b0,(string *)&local_4c8,'@');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1b0,(string *)&local_498,'@');
          local_458._32_8_ = (element_type *)0x0;
          local_458._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          psVar6 = (local_4d8->children).
                   super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar14 = (local_4d8->children).
                         super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar6;
              psVar14 = psVar14 + 1) {
            peVar7 = (psVar14->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            sVar8 = (peVar7->name)._M_string_length;
            if ((sVar8 == local_4c0) &&
               ((sVar8 == 0 ||
                (iVar11 = bcmp((peVar7->name)._M_dataplus._M_p,local_4c8,sVar8), iVar11 == 0)))) {
              sVar8 = (peVar7->unit_address)._M_string_length;
              if ((sVar8 == local_490) &&
                 ((sVar8 == 0 ||
                  (iVar11 = bcmp((peVar7->unit_address)._M_dataplus._M_p,local_498,sVar8),
                  iVar11 == 0)))) {
                local_458._32_8_ = peVar7;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 0x28),
                           &(psVar14->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount);
                break;
              }
              std::operator+(&local_3a8,&local_478,
                             &((psVar14->
                               super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->name);
              std::__cxx11::string::operator=((string *)local_458,(string *)&local_3a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                                         local_3a8.field_2._M_local_buf[0]) + 1);
              }
              local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
              local_3a8._M_string_length = 0;
              local_3a8.field_2._M_local_buf[0] = '\0';
              if ((((psVar14->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->unit_address)._M_string_length != 0) {
                std::__cxx11::string::push_back((char)local_458);
                std::__cxx11::string::_M_append
                          (local_458,
                           (ulong)(((psVar14->
                                    super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->unit_address)._M_dataplus._M_p);
              }
            }
          }
          std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_4c8);
          if (local_490 != 0) {
            std::__cxx11::string::push_back((char)&local_478);
            std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_498);
          }
          uVar10 = local_458._32_8_;
          local_4d8 = (element_type *)local_458._32_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&_Stack_4d0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 0x28));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._40_8_);
          }
          if (local_498 != &local_488) {
            operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
          }
          if (local_4c8 != &local_4b8) {
            operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
          }
          std::__cxx11::istringstream::~istringstream(local_1b0);
          std::ios_base::~ios_base(local_138);
        } while ((element_type *)uVar10 != (element_type *)0x0);
        if (local_408 != &local_3f8) {
          operator_delete(local_408,CONCAT71(uStack_3f7,local_3f8) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
        std::ios_base::~ios_base((ios_base *)(local_330 + 0x78));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,
                          CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                                   local_478.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        pmVar13 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_4a8,(key_type *)(local_458 + 0x30));
        local_4d8 = (pmVar13->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_4d0,
                   &(pmVar13->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
      }
      if (local_4d8 == (element_type *)0x0) {
        if (this->is_plugin == true) {
          __position._M_current =
               (this->unresolved_fixups).
               super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->unresolved_fixups).
              super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            iVar11 = 10;
            std::
            vector<std::reference_wrapper<dtc::fdt::device_tree::fixup>,std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>>>
            ::_M_realloc_insert<std::reference_wrapper<dtc::fdt::device_tree::fixup>const&>
                      (local_3c0,__position,prVar12);
          }
          else {
            (__position._M_current)->_M_data = prVar12->_M_data;
            pprVar1 = &(this->unresolved_fixups).
                       super__Vector_base<std::reference_wrapper<dtc::fdt::device_tree::fixup>,_std::allocator<std::reference_wrapper<dtc::fdt::device_tree::fixup>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pprVar1 = *pprVar1 + 1;
            iVar11 = 10;
          }
        }
        else {
          fprintf(_stderr,"Failed to find node with label: %s\n",local_428._M_dataplus._M_p);
          if ((pointer)local_458._8_8_ != (pointer)0x0) {
            resolve_cross_references((device_tree *)local_458);
          }
          this->valid = false;
          iVar11 = 1;
        }
      }
      else {
        local_3e8 = local_4d8;
        local_3e0._M_nxt = (_Hash_node_base *)_Stack_4d0._M_pi;
        if (_Stack_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Stack_4d0._M_pi)->_M_use_count = (_Stack_4d0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Stack_4d0._M_pi)->_M_use_count = (_Stack_4d0._M_pi)->_M_use_count + 1;
          }
        }
        assign_phandle((device_tree *)local_330,(node_ptr *)this,(uint32_t *)&local_3e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e0._M_nxt);
        }
        property_value::push_to_buffer
                  (*(property_value **)
                    ((long)&(((pointer)(local_330._0_8_ + 0x40))->first).field_2 + 8),
                   &prVar12->_M_data->val->byte_data);
        ppVar4 = prVar12->_M_data->val;
        if ((long)(ppVar4->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ppVar4->byte_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != 4) {
          __assert_fail("i.get().val.byte_data.size() == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                        ,0x5e1,"void dtc::fdt::device_tree::resolve_cross_references(uint32_t &)");
        }
        if ((pointer)local_330._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._8_8_);
        }
        iVar11 = 0;
      }
      if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
        operator_delete((void *)local_458._0_8_,CONCAT71(local_458._17_7_,local_458[0x10]) + 1);
      }
      if (_Stack_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_4d0._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        (ulong)(local_428.field_2._M_allocated_capacity + 1));
      }
    } while (((iVar11 == 10) || (iVar11 == 0)) && (prVar12 = prVar12 + 1, prVar12 != local_4a0));
  }
  if (local_3d8 != (reference_wrapper<dtc::fdt::device_tree::fixup> *)0x0) {
    operator_delete(local_3d8,local_3c8 - (long)local_3d8);
  }
  std::
  _Hashtable<dtc::fdt::property_value_*,_std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>,_std::allocator<std::pair<dtc::fdt::property_value_*const,_dtc::fdt::device_tree::fixup_&>_>,_std::__detail::_Select1st,_std::equal_to<dtc::fdt::property_value_*>,_std::hash<dtc::fdt::property_value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_368);
  return;
}

Assistant:

void
device_tree::resolve_cross_references(uint32_t &phandle)
{
	for (auto *pv : cross_references)
	{
		node_path path = node_paths[pv->string_data];
		auto p = path.begin();
		auto pe = path.end();
		if (p != pe)
		{
			// Skip the first name in the path.  It's always "", and implicitly /
			for (++p ; p!=pe ; ++p)
			{
				pv->byte_data.push_back('/');
				push_string(pv->byte_data, p->first);
				if (!(p->second.empty()))
				{
					pv->byte_data.push_back('@');
					push_string(pv->byte_data, p->second);
				}
			}
			pv->byte_data.push_back(0);
		}
	}
	std::unordered_map<property_value*, fixup&> phandle_set;
	for (auto &i : fixups)
	{
		phandle_set.insert({&i.val, i});
	}
	std::vector<std::reference_wrapper<fixup>> sorted_phandles;
	root->visit([&](node &n, node *) {
		for (auto &p : n.properties())
		{
			for (auto &v : *p)
			{
				auto i = phandle_set.find(&v);
				if (i != phandle_set.end())
				{
					sorted_phandles.push_back(i->second);
				}
			}
		}
		// Allow recursion
		return node::VISIT_RECURSE;
	}, nullptr);
	assert(sorted_phandles.size() == fixups.size());
	for (auto &i : sorted_phandles)
	{
		string target_name = i.get().val.string_data;
		node_ptr target;
		string possible;
		// If the node name is a path, then look it up by following the path,
		// otherwise jump directly to the named node.
		if (target_name[0] == '/')
		{
			string path;
			target = root;
			std::istringstream ss(target_name);
			string path_element;
			// Read the leading /
			std::getline(ss, path_element, '/');
			// Iterate over path elements
			while (!ss.eof())
			{
				path += '/';
				std::getline(ss, path_element, '/');
				std::istringstream nss(path_element);
				string node_name, node_address;
				std::getline(nss, node_name, '@');
				std::getline(nss, node_address, '@');
				node_ptr next;
				for (auto &c : target->child_nodes())
				{
					if (c->name == node_name)
					{
						if (c->unit_address == node_address)
						{
							next = c;
							break;
						}
						else
						{
							possible = path + c->name;
							if (c->unit_address != string())
							{
								possible += '@';
								possible += c->unit_address;
							}
						}
					}
				}
				path += node_name;
				if (node_address != string())
				{
					path += '@';
					path += node_address;
				}
				target = next;
				if (target == nullptr)
				{
					break;
				}
			}
		}
		else
		{
			target = node_names[target_name];
		}
		if (target == nullptr)
		{
			if (is_plugin)
			{
				unresolved_fixups.push_back(i);
				continue;
			}
			else
			{
				fprintf(stderr, "Failed to find node with label: %s\n", target_name.c_str());
				if (possible != string())
				{
					fprintf(stderr, "Possible intended match: %s\n", possible.c_str());
				}
				valid = 0;
				return;
			}
		}
		// If there is an existing phandle, use it
		property_ptr p = assign_phandle(target, phandle);
		p->begin()->push_to_buffer(i.get().val.byte_data);
		assert(i.get().val.byte_data.size() == 4);
	}
}